

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O2

void pbrt::
     LogFatal<char_const(&)[21],char_const(&)[21],char_const(&)[21],int&,char_const(&)[21],int&>
               (LogLevel level,char *file,int line,char *fmt,char (*args) [21],char (*args_1) [21],
               char (*args_2) [21],int *args_3,char (*args_4) [21],int *args_5)

{
  int *in_stack_ffffffffffffffb8;
  string local_40;
  
  StringPrintf<char_const(&)[21],char_const(&)[21],char_const(&)[21],int&,char_const(&)[21],int&>
            (&local_40,(pbrt *)fmt,*args,args_1,args_2,(char (*) [21])args_3,(int *)args_4,
             (char (*) [21])args_5,in_stack_ffffffffffffffb8);
  LogFatal(level,file,line,local_40._M_dataplus._M_p);
}

Assistant:

inline void LogFatal(LogLevel level, const char *file, int line, const char *fmt,
                     Args &&... args) {
#ifdef PBRT_IS_GPU_CODE
    LogFatal(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    LogFatal(level, file, line, s.c_str());
#endif
}